

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O1

void __thiscall kj::Thread::Thread(Thread *this,Function<void_()> *func)

{
  int iVar1;
  ThreadState *this_00;
  Fault f;
  Function<void_()> local_50;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  this_00 = (ThreadState *)operator_new(0x1c0);
  local_50.impl.disposer = (func->impl).disposer;
  local_50.impl.ptr = (func->impl).ptr;
  (func->impl).ptr = (Iface *)0x0;
  ThreadState::ThreadState(this_00,&local_50);
  if (local_50.impl.ptr != (Iface *)0x0) {
    local_50.impl.ptr = (Iface *)0x0;
    (**(local_50.impl.disposer)->_vptr_Disposer)();
  }
  this->state = this_00;
  this->detached = false;
  iVar1 = pthread_create(&this->threadId,(pthread_attr_t *)0x0,runThread,this_00);
  if (iVar1 == 0) {
    return;
  }
  ThreadState::unref(this->state);
  local_40.exception = (Exception *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  kj::_::Debug::Fault::init
            (&local_40,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
            );
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

Thread::Thread(Function<void()> func): state(new ThreadState(kj::mv(func))) {
  static_assert(sizeof(threadId) >= sizeof(pthread_t),
                "pthread_t is larger than a long long on your platform.  Please port.");

  int pthreadResult = pthread_create(reinterpret_cast<pthread_t*>(&threadId),
                                     nullptr, &runThread, state);
  if (pthreadResult != 0) {
    state->unref();
    KJ_FAIL_SYSCALL("pthread_create", pthreadResult);
  }
}